

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void f_parser(lua_State *L,void *ud)

{
  long lVar1;
  byte *pbVar2;
  char *pcVar3;
  uint local_44;
  char *local_40;
  uint local_38;
  int fixed;
  int c;
  char *mode;
  SParser *p;
  LClosure *cl;
  void *ud_local;
  lua_State *L_local;
  
  if (*(long *)((long)ud + 0x50) == 0) {
    local_40 = "bt";
  }
  else {
    local_40 = *(char **)((long)ud + 0x50);
  }
  lVar1 = **ud;
  **ud = lVar1 + -1;
  if (lVar1 == 0) {
    local_44 = luaZ_fill(*ud);
  }
  else {
    pbVar2 = *(byte **)(*ud + 8);
    *(byte **)(*ud + 8) = pbVar2 + 1;
    local_44 = (uint)*pbVar2;
  }
  if (local_44 == 0x1b) {
    pcVar3 = strchr(local_40,0x42);
    if (pcVar3 == (char *)0x0) {
      checkmode(L,local_40,"binary");
    }
    local_38 = (uint)(pcVar3 != (char *)0x0);
    p = (SParser *)luaU_undump(L,*ud,*(char **)((long)ud + 0x58),local_38);
  }
  else {
    checkmode(L,local_40,"text");
    p = (SParser *)
        luaY_parser(L,*ud,(Mbuffer *)((long)ud + 8),(Dyndata *)((long)ud + 0x20),
                    *(char **)((long)ud + 0x58),local_44);
  }
  luaF_initupvals(L,(LClosure *)p);
  return;
}

Assistant:

static void f_parser (lua_State *L, void *ud) {
  LClosure *cl;
  struct SParser *p = cast(struct SParser *, ud);
  const char *mode = p->mode ? p->mode : "bt";
  int c = zgetc(p->z);  /* read first character */
  if (c == LUA_SIGNATURE[0]) {
    int fixed = 0;
    if (strchr(mode, 'B') != NULL)
      fixed = 1;
    else
      checkmode(L, mode, "binary");
    cl = luaU_undump(L, p->z, p->name, fixed);
  }
  else {
    checkmode(L, mode, "text");
    cl = luaY_parser(L, p->z, &p->buff, &p->dyd, p->name, c);
  }
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luaF_initupvals(L, cl);
}